

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void ibfstages(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  long in_RCX;
  float *in_RDX;
  byte in_SIL;
  float *in_RDI;
  ulong in_R8;
  long in_R9;
  float w0i;
  float w0r;
  float *u2i;
  float *u2r;
  float *u1i;
  float *u1r;
  float *u0i;
  float *u0r;
  float *p3r;
  float *p2r;
  float *p1r;
  float *p0r;
  float *pstrt;
  unsigned_long U2toU3;
  unsigned_long SameUCnt;
  unsigned_long DiffUCnt;
  unsigned_long Uinc4;
  unsigned_long Uinc2;
  unsigned_long Uinc;
  unsigned_long NSameU;
  unsigned_long pnext;
  unsigned_long pinc;
  unsigned_long posi;
  unsigned_long pos;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  ulong local_80;
  ulong local_78;
  long lStack_70;
  float Two;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  float f7i;
  float f7r;
  float f6i;
  float f6r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float w3i;
  float w3r;
  float w2i;
  float w2r;
  float w1i;
  float w1r;
  
  _f5i = in_R8 << 1;
  _f6i = in_R8 << 4;
  _f3i = in_R8 * 8;
  _f7i = ((ulong)(1L << (in_SIL & 0x3f)) >> 3) / in_R8;
  _t0i = _f7i * in_RCX;
  _t1i = _t0i * 2;
  lStack_70 = _t0i * 4;
  lVar19 = ((ulong)(1L << (in_SIL & 0x3f)) >> 3) * in_RCX;
  _f1i = in_R8;
  for (_f2i = in_R9; _f4i = _f3i + 1, 0 < _f2i; _f2i = _f2i + -1) {
    local_e0 = in_RDX + (1L << (in_SIL - 2 & 0x3f)) * in_RCX;
    local_e4 = *in_RDX;
    local_e8 = *local_e0;
    local_ec = *in_RDX;
    local_f0 = *local_e0;
    local_f4 = *in_RDX;
    local_f8 = *local_e0;
    local_fc = in_RDX[lVar19];
    local_100 = local_e0[-lVar19];
    local_a0 = in_RDI + _f5i;
    local_a8 = local_a0 + _f5i;
    local_d8 = in_RDX;
    local_d0 = local_e0;
    local_c8 = in_RDX;
    local_c0 = local_e0;
    local_b8 = in_RDX;
    local_90 = in_RDI;
    for (local_78 = _f1i; local_b0 = local_a8 + _f5i, local_78 != 0; local_78 = local_78 - 1) {
      local_104 = *local_90;
      local_108 = local_90[1];
      local_10c = *local_a0;
      local_110 = local_a0[1];
      local_98 = local_90;
      local_80 = _f7i;
      while (local_80 = local_80 - 1, local_80 != 0) {
        fVar3 = (local_104 + local_10c * local_e4) - local_110 * local_e8;
        fVar1 = local_108 + local_10c * local_e8 + local_110 * local_e4;
        fVar4 = local_104 * 2.0 - fVar3;
        fVar5 = local_108 * 2.0 - fVar1;
        fVar2 = (*local_a8 - *local_b0 * local_e4) + local_b0[1] * local_e8;
        fVar6 = (local_a8[1] - *local_b0 * local_e8) - local_b0[1] * local_e4;
        fVar7 = *local_a8 * 2.0 - fVar2;
        fVar8 = local_a8[1] * 2.0 - fVar6;
        fVar9 = (fVar3 + fVar7 * local_ec) - fVar8 * local_f0;
        fVar7 = fVar1 + fVar7 * local_f0 + fVar8 * local_ec;
        fVar8 = fVar3 * 2.0 - fVar9;
        fVar10 = fVar1 * 2.0 - fVar7;
        fVar1 = fVar4 + fVar2 * local_f0 + fVar6 * local_ec;
        fVar2 = (fVar5 - fVar2 * local_ec) + fVar6 * local_f0;
        fVar11 = fVar4 * 2.0 - fVar1;
        fVar12 = fVar5 * 2.0 - fVar2;
        fVar6 = (local_98[_f3i] + local_a0[_f3i] * local_e4) - local_a0[_f4i] * local_e8;
        fVar3 = local_98[_f4i] + local_a0[_f3i] * local_e8 + local_a0[_f4i] * local_e4;
        fVar13 = local_98[_f3i] * 2.0 - fVar6;
        fVar14 = local_98[_f4i] * 2.0 - fVar3;
        fVar4 = (local_a8[_f3i] - local_b0[_f3i] * local_e4) + local_b0[_f4i] * local_e8;
        fVar15 = (local_a8[_f4i] - local_b0[_f3i] * local_e8) - local_b0[_f4i] * local_e4;
        fVar5 = local_a8[_f3i] * 2.0 - fVar4;
        fVar16 = local_a8[_f4i] * 2.0 - fVar15;
        fVar17 = (fVar6 + fVar5 * local_ec) - fVar16 * local_f0;
        fVar5 = fVar3 + fVar5 * local_f0 + fVar16 * local_ec;
        fVar16 = fVar6 * 2.0 - fVar17;
        fVar18 = fVar3 * 2.0 - fVar5;
        fVar3 = fVar13 + fVar4 * local_f0 + fVar15 * local_ec;
        fVar4 = (fVar14 - fVar4 * local_ec) + fVar15 * local_f0;
        fVar13 = fVar13 * 2.0 - fVar3;
        fVar14 = fVar14 * 2.0 - fVar4;
        fVar6 = (fVar9 - fVar17 * local_f4) + fVar5 * local_f8;
        fVar15 = (fVar7 - fVar17 * local_f8) - fVar5 * local_f4;
        fVar5 = (fVar11 - fVar13 * local_fc) + fVar14 * local_100;
        fVar13 = (fVar12 - fVar13 * local_100) - fVar14 * local_fc;
        local_98[_f3i] = fVar6;
        local_98[_f4i] = fVar15;
        *local_98 = fVar9 * 2.0 - fVar6;
        local_98[1] = fVar7 * 2.0 - fVar15;
        local_98 = local_98 + _f6i;
        local_104 = *local_98;
        local_108 = local_98[1];
        local_a0[_f3i] = fVar5;
        local_a0[_f4i] = fVar13;
        *local_a0 = fVar11 * 2.0 - fVar5;
        local_a0[1] = fVar12 * 2.0 - fVar13;
        local_a0 = local_a0 + _f6i;
        local_10c = *local_a0;
        local_110 = local_a0[1];
        fVar7 = (fVar8 - fVar16 * local_f8) - fVar18 * local_f4;
        fVar5 = (fVar10 + fVar16 * local_f4) - fVar18 * local_f8;
        fVar6 = (fVar1 - fVar3 * local_100) - fVar4 * local_fc;
        fVar3 = (fVar2 + fVar3 * local_fc) - fVar4 * local_100;
        *local_a8 = fVar7;
        local_a8[1] = fVar5;
        local_a8[_f3i] = fVar8 * 2.0 - fVar7;
        local_a8[_f4i] = fVar10 * 2.0 - fVar5;
        local_a8 = local_a8 + _f6i;
        *local_b0 = fVar6;
        local_b0[1] = fVar3;
        local_b0[_f3i] = fVar1 * 2.0 - fVar6;
        local_b0[_f4i] = fVar2 * 2.0 - fVar3;
        local_b0 = local_b0 + _f6i;
      }
      fVar3 = (local_104 + local_10c * local_e4) - local_110 * local_e8;
      fVar1 = local_108 + local_10c * local_e8 + local_110 * local_e4;
      fVar4 = local_104 * 2.0 - fVar3;
      fVar5 = local_108 * 2.0 - fVar1;
      fVar2 = (*local_a8 - *local_b0 * local_e4) + local_b0[1] * local_e8;
      fVar6 = (local_a8[1] - *local_b0 * local_e8) - local_b0[1] * local_e4;
      fVar7 = *local_a8 * 2.0 - fVar2;
      fVar8 = local_a8[1] * 2.0 - fVar6;
      fVar9 = (fVar3 + fVar7 * local_ec) - fVar8 * local_f0;
      fVar7 = fVar1 + fVar7 * local_f0 + fVar8 * local_ec;
      fVar3 = fVar3 * 2.0 - fVar9;
      fVar8 = fVar1 * 2.0 - fVar7;
      fVar1 = fVar4 + fVar2 * local_f0 + fVar6 * local_ec;
      fVar2 = (fVar5 - fVar2 * local_ec) + fVar6 * local_f0;
      fVar4 = fVar4 * 2.0 - fVar1;
      fVar5 = fVar5 * 2.0 - fVar2;
      if (local_78 == (long)_f1i / 2) {
        lStack_70 = -lStack_70;
      }
      local_b8 = local_b8 + lStack_70;
      local_c0 = local_c0 + -lStack_70;
      local_c8 = local_c8 + _t1i;
      local_d0 = local_d0 + -_t1i;
      local_d8 = local_d8 + _t0i;
      local_e0 = local_e0 + -_t0i;
      local_90 = local_90 + 2;
      fVar12 = (local_98[_f3i] + local_a0[_f3i] * local_e4) - local_a0[_f4i] * local_e8;
      fVar6 = local_98[_f4i] + local_a0[_f3i] * local_e8 + local_a0[_f4i] * local_e4;
      fVar13 = local_98[_f3i] * 2.0 - fVar12;
      fVar14 = local_98[_f4i] * 2.0 - fVar6;
      fVar10 = (local_a8[_f3i] - local_b0[_f3i] * local_e4) + local_b0[_f4i] * local_e8;
      fVar15 = (local_a8[_f4i] - local_b0[_f3i] * local_e8) - local_b0[_f4i] * local_e4;
      fVar11 = local_a8[_f3i] * 2.0 - fVar10;
      fVar16 = local_a8[_f4i] * 2.0 - fVar15;
      fVar17 = (fVar12 + fVar11 * local_ec) - fVar16 * local_f0;
      fVar11 = fVar6 + fVar11 * local_f0 + fVar16 * local_ec;
      fVar12 = fVar12 * 2.0 - fVar17;
      fVar16 = fVar6 * 2.0 - fVar11;
      fVar6 = fVar13 + fVar10 * local_f0 + fVar15 * local_ec;
      fVar10 = (fVar14 - fVar10 * local_ec) + fVar15 * local_f0;
      fVar13 = fVar13 * 2.0 - fVar6;
      fVar14 = fVar14 * 2.0 - fVar10;
      local_e4 = *local_b8;
      local_e8 = *local_c0;
      local_ec = *local_c8;
      local_f0 = *local_d0;
      if (local_78 <= (ulong)((long)_f1i / 2)) {
        local_e4 = -local_e4;
      }
      fVar15 = (fVar9 - fVar17 * local_f4) + fVar11 * local_f8;
      fVar11 = (fVar7 - fVar17 * local_f8) - fVar11 * local_f4;
      fVar17 = (fVar3 - fVar12 * local_f8) - fVar16 * local_f4;
      fVar12 = (fVar8 + fVar12 * local_f4) - fVar16 * local_f8;
      local_98[_f3i] = fVar15;
      *local_a8 = fVar17;
      local_98[_f4i] = fVar11;
      local_a8[1] = fVar12;
      local_f4 = *local_d8;
      local_f8 = *local_e0;
      *local_98 = fVar9 * 2.0 - fVar15;
      local_a8[_f3i] = fVar3 * 2.0 - fVar17;
      local_98[1] = fVar7 * 2.0 - fVar11;
      local_a8[_f4i] = fVar8 * 2.0 - fVar12;
      local_a8 = local_90 + _f5i * 2;
      fVar7 = (fVar4 - fVar13 * local_fc) + fVar14 * local_100;
      fVar3 = (fVar5 - fVar13 * local_100) - fVar14 * local_fc;
      fVar8 = (fVar1 - fVar6 * local_100) - fVar10 * local_fc;
      fVar6 = (fVar2 + fVar6 * local_fc) - fVar10 * local_100;
      local_a0[_f3i] = fVar7;
      *local_b0 = fVar8;
      local_a0[_f4i] = fVar3;
      local_b0[1] = fVar6;
      local_fc = local_d8[lVar19];
      local_100 = local_e0[-lVar19];
      *local_a0 = fVar4 * 2.0 - fVar7;
      local_b0[_f3i] = fVar1 * 2.0 - fVar8;
      local_a0[1] = fVar5 * 2.0 - fVar3;
      local_b0[_f4i] = fVar2 * 2.0 - fVar6;
      local_a0 = local_90 + _f5i;
    }
    _f7i = _f7i >> 3;
    _t0i = _t0i >> 3;
    _t1i = _t1i >> 3;
    lStack_70 = _t0i << 2;
    _f1i = _f1i << 3;
    _f5i = _f5i << 3;
    _f6i = _f6i << 3;
    _f3i = _f3i * 8;
  }
  return;
}

Assistant:

static inline void ibfstages(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt){
/***   RADIX 8 Stages	***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long 	NSameU;
unsigned long 	Uinc;
unsigned long 	Uinc2;
unsigned long 	Uinc4;
unsigned long 	DiffUCnt;
unsigned long 	SameUCnt;
unsigned long 	U2toU3;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;
float 	*u0r, *u0i, *u1r, *u1i, *u2r, *u2i;

float w0r, w0i, w1r, w1i, w2r, w2i, w3r, w3i;
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 8;
pos = pinc * 4;
posi =  pos + 1;
NSameU = POW2(M) / 8 /NDiffU;	// 8 pts per butterfly
Uinc = NSameU * Ustride;
Uinc2 = Uinc * 2;
Uinc4 = Uinc * 4;
U2toU3 = (POW2(M) / 8)*Ustride;
for (; StageCnt > 0 ; StageCnt--){

	u0r = &Utbl[0];
	u0i = &Utbl[POW2(M-2)*Ustride];
	u1r = u0r;
	u1i = u0i;
	u2r = u0r;
	u2i = u0i;

	w0r =  *u0r;
	w0i =  *u0i;
	w1r =  *u1r;
	w1i =  *u1i;
	w2r =  *u2r;
	w2i =  *u2i;
	w3r =  *(u2r+U2toU3);
	w3i =  *(u2i-U2toU3);

	pstrt = ioptr;

	p0r = pstrt;
	p1r = pstrt+pinc;
	p2r = p1r+pinc;
	p3r = p2r+pinc;

			/* Butterflys		*/
			/*
			f0	-	-	t0	-	-	f0	-	-	f0
			f1	- w0-	f1	-	-	f1	-	-	f1
			f2	-	-	f2	- w1-	f2	-	-	f4
			f3	- w0-	t1	- iw1-	f3	-	-	f5

			f4	-	-	t0	-	-	f4	- w2-	t0
			f5	- w0-	f5	-	-	f5	- w3-	t1
			f6	-	-	f6	- w1-	f6	- iw2-	f6
			f7	- w0-	t1	- iw1-	f7	- iw3-	f7
			*/

	for (DiffUCnt = NDiffU; DiffUCnt > 0 ; DiffUCnt--){
		f0r = *p0r;
		f0i = *(p0r + 1);
		f1r = *p1r;
		f1i = *(p1r + 1);
		for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){
			f2r = *p2r;
			f2i = *(p2r + 1);
			f3r = *p3r;
			f3i = *(p3r + 1);

			t0r = f0r + f1r * w0r - f1i * w0i;
			t0i = f0i + f1r * w0i + f1i * w0r;
			f1r = f0r * Two - t0r;
			f1i = f0i * Two - t0i;

			f4r = *(p0r + pos);
			f4i = *(p0r + posi);
			f5r = *(p1r + pos);
			f5i = *(p1r + posi);

			f6r = *(p2r + pos);
			f6i = *(p2r + posi);
			f7r = *(p3r + pos);
			f7i = *(p3r + posi);

			t1r = f2r - f3r * w0r + f3i * w0i;
			t1i = f2i - f3r * w0i - f3i * w0r;
			f2r = f2r * Two - t1r;
			f2i = f2i * Two - t1i;

			f0r = t0r + f2r * w1r - f2i * w1i;
			f0i = t0i + f2r * w1i + f2i * w1r;
			f2r = t0r * Two - f0r;
			f2i = t0i * Two - f0i;

			f3r = f1r + t1r * w1i + t1i * w1r;
			f3i = f1i - t1r * w1r + t1i * w1i;
			f1r = f1r * Two - f3r;
			f1i = f1i * Two - f3i;


			t0r = f4r + f5r * w0r - f5i * w0i;
			t0i = f4i + f5r * w0i + f5i * w0r;
			f5r = f4r * Two - t0r;
			f5i = f4i * Two - t0i;

			t1r = f6r - f7r * w0r + f7i * w0i;
			t1i = f6i - f7r * w0i - f7i * w0r;
			f6r = f6r * Two - t1r;
			f6i = f6i * Two - t1i;

			f4r = t0r + f6r * w1r - f6i * w1i;
			f4i = t0i + f6r * w1i + f6i * w1r;
			f6r = t0r * Two - f4r;
			f6i = t0i * Two - f4i;

			f7r = f5r + t1r * w1i + t1i * w1r;
			f7i = f5i - t1r * w1r + t1i * w1i;
			f5r = f5r * Two - f7r;
			f5i = f5i * Two - f7i;

			t0r = f0r - f4r * w2r + f4i * w2i;
			t0i = f0i - f4r * w2i - f4i * w2r;
			f0r = f0r * Two - t0r;
			f0i = f0i * Two - t0i;

			t1r = f1r - f5r * w3r + f5i * w3i;
			t1i = f1i - f5r * w3i - f5i * w3r;
			f1r = f1r * Two - t1r;
			f1i = f1i * Two - t1i;

			*(p0r + pos) = t0r;
			*(p0r + posi) = t0i;
			*p0r = f0r;
			*(p0r + 1) = f0i;

			p0r += pnext;
			f0r = *p0r;
			f0i = *(p0r + 1);

			*(p1r + pos) = t1r;
			*(p1r + posi) = t1i;
			*p1r = f1r;
			*(p1r + 1) = f1i;

			p1r += pnext;

			f1r = *p1r;
			f1i = *(p1r + 1);

			f4r = f2r - f6r * w2i - f6i * w2r;
			f4i = f2i + f6r * w2r - f6i * w2i;
			f6r = f2r * Two - f4r;
			f6i = f2i * Two - f4i;

			f5r = f3r - f7r * w3i - f7i * w3r;
			f5i = f3i + f7r * w3r - f7i * w3i;
			f7r = f3r * Two - f5r;
			f7i = f3i * Two - f5i;

			*p2r = f4r;
			*(p2r + 1) = f4i;
			*(p2r + pos) = f6r;
			*(p2r + posi) = f6i;

			p2r += pnext;

			*p3r = f5r;
			*(p3r + 1) = f5i;
			*(p3r + pos) = f7r;
			*(p3r + posi) = f7i;

			p3r += pnext;

		}
		
		f2r = *p2r;
		f2i = *(p2r + 1);
		f3r = *p3r;
		f3i = *(p3r + 1);

		t0r = f0r + f1r * w0r - f1i * w0i;
		t0i = f0i + f1r * w0i + f1i * w0r;
		f1r = f0r * Two - t0r;
		f1i = f0i * Two - t0i;

		f4r = *(p0r + pos);
		f4i = *(p0r + posi);
		f5r = *(p1r + pos);
		f5i = *(p1r + posi);

		f6r = *(p2r + pos);
		f6i = *(p2r + posi);
		f7r = *(p3r + pos);
		f7i = *(p3r + posi);

		t1r = f2r - f3r * w0r + f3i * w0i;
		t1i = f2i - f3r * w0i - f3i * w0r;
		f2r = f2r * Two - t1r;
		f2i = f2i * Two - t1i;

		f0r = t0r + f2r * w1r - f2i * w1i;
		f0i = t0i + f2r * w1i + f2i * w1r;
		f2r = t0r * Two - f0r;
		f2i = t0i * Two - f0i;

		f3r = f1r + t1r * w1i + t1i * w1r;
		f3i = f1i - t1r * w1r + t1i * w1i;
		f1r = f1r * Two - f3r;
		f1i = f1i * Two - f3i;

		if (DiffUCnt == NDiffU/2)
			Uinc4 = -Uinc4;

		u0r += Uinc4;
		u0i -= Uinc4;
		u1r += Uinc2;
		u1i -= Uinc2;
		u2r += Uinc;
		u2i -= Uinc;

		pstrt += 2;

		t0r = f4r + f5r * w0r - f5i * w0i;
		t0i = f4i + f5r * w0i + f5i * w0r;
		f5r = f4r * Two - t0r;
		f5i = f4i * Two - t0i;

		t1r = f6r - f7r * w0r + f7i * w0i;
		t1i = f6i - f7r * w0i - f7i * w0r;
		f6r = f6r * Two - t1r;
		f6i = f6i * Two - t1i;

		f4r = t0r + f6r * w1r - f6i * w1i;
		f4i = t0i + f6r * w1i + f6i * w1r;
		f6r = t0r * Two - f4r;
		f6i = t0i * Two - f4i;

		f7r = f5r + t1r * w1i + t1i * w1r;
		f7i = f5i - t1r * w1r + t1i * w1i;
		f5r = f5r * Two - f7r;
		f5i = f5i * Two - f7i;

		w0r = *u0r;
		w0i =  *u0i;
		w1r =  *u1r;
		w1i =  *u1i;

		if (DiffUCnt <= NDiffU/2)
			w0r = -w0r;

		t0r = f0r - f4r * w2r + f4i * w2i;
		t0i = f0i - f4r * w2i - f4i * w2r;
		f0r = f0r * Two - t0r;
		f0i = f0i * Two - t0i;

		f4r = f2r - f6r * w2i - f6i * w2r;
		f4i = f2i + f6r * w2r - f6i * w2i;
		f6r = f2r * Two - f4r;
		f6i = f2i * Two - f4i;

		*(p0r + pos) = t0r;
		*p2r = f4r;
		*(p0r + posi) = t0i;
		*(p2r + 1) = f4i;
		w2r =  *u2r;
		w2i =  *u2i;
		*p0r = f0r;
		*(p2r + pos) = f6r;
		*(p0r + 1) = f0i;
		*(p2r + posi) = f6i;

		p0r = pstrt;
		p2r = pstrt + pinc + pinc;	

		t1r = f1r - f5r * w3r + f5i * w3i;
		t1i = f1i - f5r * w3i - f5i * w3r;
		f1r = f1r * Two - t1r;
		f1i = f1i * Two - t1i;

		f5r = f3r - f7r * w3i - f7i * w3r;
		f5i = f3i + f7r * w3r - f7i * w3i;
		f7r = f3r * Two - f5r;
		f7i = f3i * Two - f5i;

		*(p1r + pos) = t1r;
		*p3r = f5r;
		*(p1r + posi) = t1i;
		*(p3r + 1) = f5i;
		w3r =  *(u2r+U2toU3);
		w3i =  *(u2i-U2toU3);
		*p1r = f1r;
		*(p3r + pos) = f7r;
		*(p1r + 1) = f1i;
		*(p3r + posi) = f7i;

		p1r = pstrt + pinc;
		p3r = p2r + pinc;	
	}
	NSameU /= 8;
	Uinc /= 8;
	Uinc2 /= 8;
	Uinc4 = Uinc * 4;
	NDiffU *= 8;
	pinc *= 8;
	pnext *= 8;
	pos *= 8;
	posi =  pos + 1;
}
}